

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_writeCTable(void *dst,size_t maxDstSize,HUF_CElt *CTable,U32 maxSymbolValue,U32 huffLog)

{
  uint uVar1;
  size_t code;
  uint in_ECX;
  long in_RDX;
  ulong in_RSI;
  char *in_RDI;
  int in_R8D;
  size_t hSize;
  U32 n;
  BYTE *op;
  BYTE huffWeight [255];
  BYTE bitsToWeight [13];
  uint local_144;
  char local_138 [259];
  char local_35 [13];
  int local_28;
  uint local_24;
  long local_20;
  ulong local_18;
  size_t local_8;
  
  if (in_ECX < 0x100) {
    local_35[0] = '\0';
    local_28 = in_R8D;
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    for (local_144 = 1; local_144 < local_28 + 1U; local_144 = local_144 + 1) {
      local_35[local_144] = ((char)local_28 + '\x01') - (char)local_144;
    }
    for (local_144 = 0; local_144 < local_24; local_144 = local_144 + 1) {
      local_138[local_144] = local_35[*(byte *)(local_20 + 2 + (ulong)local_144 * 4)];
    }
    code = HUF_compressWeights((void *)huffWeight._120_8_,huffWeight._112_8_,
                               (void *)huffWeight._104_8_,huffWeight._96_8_);
    uVar1 = ERR_isError(code);
    local_8 = code;
    if (uVar1 == 0) {
      if (code < 2 || local_24 >> 1 <= code) {
        if (local_24 < 0x81) {
          if (local_18 < (local_24 + 1 >> 1) + 1) {
            local_8 = 0xffffffffffffffba;
          }
          else {
            *in_RDI = (char)local_24 + '\x7f';
            local_138[local_24] = '\0';
            for (local_144 = 0; local_144 < local_24; local_144 = local_144 + 2) {
              in_RDI[(local_144 >> 1) + 1] =
                   local_138[local_144] * '\x10' + local_138[local_144 + 1];
            }
            local_8 = (ulong)((local_24 + 1 >> 1) + 1);
          }
        }
        else {
          local_8 = 0xffffffffffffffff;
        }
      }
      else {
        *in_RDI = (char)code;
        local_8 = code + 1;
      }
    }
  }
  else {
    local_8 = 0xffffffffffffffd2;
  }
  return local_8;
}

Assistant:

size_t HUF_writeCTable (void* dst, size_t maxDstSize,
                        const HUF_CElt* CTable, U32 maxSymbolValue, U32 huffLog)
{
    BYTE bitsToWeight[HUF_TABLELOG_MAX + 1];   /* precomputed conversion table */
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX];
    BYTE* op = (BYTE*)dst;
    U32 n;

     /* check conditions */
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        huffWeight[n] = bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, huffWeight, maxSymbolValue) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((huffWeight[n] << 4) + huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}